

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

void vera::lineBoundingBox(vec4 *_bbox,Shader *_program)

{
  vec<2,_float,_(glm::qualifier)0> local_64;
  vec<2,_float,_(glm::qualifier)0> local_5c;
  vec<2,_float,_(glm::qualifier)0> local_54;
  vec<2,_float,_(glm::qualifier)0> local_4c [2];
  vec<2,_float,_(glm::qualifier)0> local_38;
  undefined1 local_30 [8];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  positions;
  Shader *_program_local;
  vec4 *_bbox_local;
  
  positions.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_program;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)local_30);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_38,(_bbox->field_0).x,(_bbox->field_1).y);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_30,&local_38);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(local_4c,(_bbox->field_2).z,(_bbox->field_1).y);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_30,local_4c);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_54,(_bbox->field_2).z,(_bbox->field_3).w);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_30,&local_54);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_5c,(_bbox->field_0).x,(_bbox->field_3).w);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_30,&local_5c);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_64,(_bbox->field_0).x,(_bbox->field_1).y);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_30,&local_64);
  line((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
        *)local_30,
       (Shader *)
       positions.
       super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)local_30);
  return;
}

Assistant:

void lineBoundingBox(const glm::vec4& _bbox, Shader* _program) {
    std::vector<glm::vec2> positions;
    positions.push_back( glm::vec2(_bbox.x, _bbox.y) );
    positions.push_back( glm::vec2(_bbox.z, _bbox.y) );
    positions.push_back( glm::vec2(_bbox.z, _bbox.w) );
    positions.push_back( glm::vec2(_bbox.x, _bbox.w) );
    positions.push_back( glm::vec2(_bbox.x, _bbox.y) );
    line(positions, _program);
}